

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O1

void pbrt::createFilm(SP *ours,SP *pbrt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Alloc_hider _Var5;
  size_type sVar6;
  bool bVar7;
  bool bVar8;
  vec2i resolution;
  string fileName;
  string local_f8;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  vec2i local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [16];
  _Base_ptr local_80 [2];
  _Base_ptr local_70 [2];
  _Rb_tree_node_base *local_60 [2];
  _Rb_tree_node_base local_50;
  
  peVar2 = (((pbrt->super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
           ->film).super___shared_ptr<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    local_60[0] = &local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"xresolution","");
    syntactic::ParamSet::findParam<int>
              ((ParamSet *)local_90,(string *)&(peVar2->super_Node).super_ParamSet);
    if (local_90._0_8_ != 0) {
      peVar3 = (((pbrt->super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->film).super___shared_ptr<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_80[0] = (_Base_ptr)local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"yresolution","");
      syntactic::ParamSet::findParam<int>
                ((ParamSet *)&local_50._M_left,(string *)&(peVar3->super_Node).super_ParamSet);
      bVar8 = local_50._M_left != (_Base_ptr)0x0;
      bVar7 = true;
      goto LAB_0013f0b2;
    }
  }
  bVar7 = false;
  bVar8 = false;
LAB_0013f0b2:
  if (bVar7) {
    if (local_50._M_right != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_right);
    }
    if (local_80[0] != (_Base_ptr)local_70) {
      operator_delete(local_80[0],(ulong)((long)&local_70[0]->_M_color + 1));
    }
  }
  if (peVar2 != (element_type *)0x0) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
    }
    if (local_60[0] != &local_50) {
      operator_delete(local_60[0],local_50._0_8_ + 1);
    }
  }
  if (bVar8) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
    peVar2 = (((pbrt->super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->film).super___shared_ptr<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    paVar1 = &local_f8.field_2;
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"filename","");
    bVar7 = syntactic::ParamSet::hasParamString(&(peVar2->super_Node).super_ParamSet,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) {
      peVar2 = (((pbrt->super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->film).super___shared_ptr<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_d8._0_8_ = &local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"filename","");
      syntactic::ParamSet::getParamString
                (&local_f8,&(peVar2->super_Node).super_ParamSet,(string *)local_d8);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,local_c8._M_allocated_capacity + 1);
      }
    }
    peVar2 = (((pbrt->super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->film).super___shared_ptr<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"xresolution","");
    syntactic::ParamSet::findParam<int>
              ((ParamSet *)local_d8,(string *)&(peVar2->super_Node).super_ParamSet);
    local_b8.x = **(int **)(local_d8._0_8_ + 0x18);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    peVar2 = (((pbrt->super___shared_ptr<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->film).super___shared_ptr<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"yresolution","");
    syntactic::ParamSet::findParam<int>
              ((ParamSet *)local_d8,(string *)&(peVar2->super_Node).super_ParamSet);
    local_b8.y = **(int **)(local_d8._0_8_ + 0x18);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_f8._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pbrt::Film,std::allocator<pbrt::Film>,pbrt::math::vec2i&,std::__cxx11::string&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length,
               (Film **)&local_f8,(allocator<pbrt::Film> *)local_d8,&local_b8,&local_b0);
    std::__shared_ptr<pbrt::Film,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<pbrt::Film,pbrt::Film>
              ((__shared_ptr<pbrt::Film,(__gnu_cxx::_Lock_policy)2> *)&local_f8,
               (Film *)local_f8._M_dataplus._M_p);
    sVar6 = local_f8._M_string_length;
    _Var5._M_p = local_f8._M_dataplus._M_p;
    peVar4 = (ours->super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    this = (peVar4->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
    (peVar4->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var5._M_p;
    (peVar4->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"warning: could not determine film resolution from pbrt scene",
               0x3c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
  }
  return;
}

Assistant:

void createFilm(Scene::SP ours, pbrt::syntactic::Scene::SP pbrt)
  {
    if (pbrt->film &&
        pbrt->film->findParam<int>("xresolution") &&
        pbrt->film->findParam<int>("yresolution")) {
      vec2i resolution;
      std::string fileName = "";
      if (pbrt->film->hasParamString("filename"))
        fileName = pbrt->film->getParamString("filename");
        
      resolution.x = pbrt->film->findParam<int>("xresolution")->get(0);
      resolution.y = pbrt->film->findParam<int>("yresolution")->get(0);
      ours->film = std::make_shared<Film>(resolution,fileName);
    } else {
      std::cout << "warning: could not determine film resolution from pbrt scene" << std::endl;
    }
  }